

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.cpp
# Opt level: O1

DomSetType * __thiscall
dg::llvmdg::PostDominanceFrontiers::calculate
          (PostDominanceFrontiers *this,PostDominatorTree *DT,DomTreeNode *Node)

{
  byte bVar1;
  char cVar2;
  _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
  *this_00;
  DomTreeNodeBase<llvm::BasicBlock> *pDVar3;
  DomSetType *pDVar4;
  _Rb_tree_node_base *p_Var5;
  DomTreeNode *pDVar6;
  DomTreeNode *__range2;
  undefined8 *puVar7;
  long lVar8;
  const_iterator cVar9;
  BasicBlock *P;
  BasicBlock *BB;
  const_arg_type_t<llvm::BasicBlock_*> local_50;
  undefined8 *local_48;
  PostDominanceFrontiers *local_40;
  key_type local_38;
  
  local_38 = *(key_type *)Node;
  local_40 = this;
  this_00 = (_Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
             *)std::
               map<llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
               ::operator[](&this->frontiers,&local_38);
  if (*(int *)(DT + 8) != 0) {
    if (local_38 != (key_type)0x0) {
      lVar8 = *(long *)(local_38 + 8);
      while ((lVar8 != 0 &&
             (bVar1 = *(byte *)(*(long *)(lVar8 + 0x18) + 0x10),
             (*(long *)(lVar8 + 0x18) == 0 || bVar1 < 0x1b) || 10 < bVar1 - 0x1c))) {
        lVar8 = *(long *)(lVar8 + 8);
      }
      if (lVar8 != 0) {
        do {
          local_50 = *(const_arg_type_t<llvm::BasicBlock_*> *)(*(long *)(lVar8 + 0x18) + 0x28);
          cVar9 = llvm::
                  DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                  ::find((DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                          *)(DT + 0x30),local_50);
          if (cVar9.Ptr == (pointer)((ulong)*(uint *)(DT + 0x40) * 0x10 + *(long *)(DT + 0x30))) {
            pDVar3 = (DomTreeNodeBase<llvm::BasicBlock> *)0x0;
          }
          else {
            pDVar3 = ((cVar9.Ptr)->
                     super_pair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>
                     ).second._M_t.
                     super___uniq_ptr_impl<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                     .super__Head_base<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_false>.
                     _M_head_impl;
          }
          if ((pDVar3 != (DomTreeNodeBase<llvm::BasicBlock> *)0x0) &&
             (*(DomTreeNode **)(pDVar3 + 8) != Node)) {
            std::
            _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
            ::_M_insert_unique<llvm::BasicBlock*const&>(this_00,&local_50);
          }
          do {
            lVar8 = *(long *)(lVar8 + 8);
            if (lVar8 == 0) break;
            bVar1 = *(byte *)(*(long *)(lVar8 + 0x18) + 0x10);
          } while ((*(long *)(lVar8 + 0x18) == 0 || bVar1 < 0x1b) || 10 < bVar1 - 0x1c);
        } while (lVar8 != 0);
      }
    }
    if ((ulong)*(uint *)(Node + 0x20) != 0) {
      puVar7 = *(undefined8 **)(Node + 0x18);
      local_48 = puVar7 + *(uint *)(Node + 0x20);
      do {
        pDVar4 = calculate(local_40,DT,(DomTreeNode *)*puVar7);
        for (p_Var5 = (pDVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != &(pDVar4->_M_t)._M_impl.super__Rb_tree_header;
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
          local_50 = *(const_arg_type_t<llvm::BasicBlock_*> *)(p_Var5 + 1);
          cVar9 = llvm::
                  DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                  ::find((DenseMapBase<llvm::DenseMap<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>,_llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>,_llvm::DenseMapInfo<llvm::BasicBlock_*,_void>,_llvm::detail::DenseMapPair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>_>
                          *)(DT + 0x30),local_50);
          if (cVar9.Ptr == (pointer)((ulong)*(uint *)(DT + 0x40) * 0x10 + *(long *)(DT + 0x30))) {
            pDVar6 = (DomTreeNode *)0x0;
          }
          else {
            pDVar6 = ((cVar9.Ptr)->
                     super_pair<llvm::BasicBlock_*,_std::unique_ptr<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>_>
                     ).second._M_t.
                     super___uniq_ptr_impl<llvm::DomTreeNodeBase<llvm::BasicBlock>,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_std::default_delete<llvm::DomTreeNodeBase<llvm::BasicBlock>_>_>
                     .super__Head_base<0UL,_llvm::DomTreeNodeBase<llvm::BasicBlock>_*,_false>.
                     _M_head_impl;
          }
          if ((pDVar6 == Node || pDVar6 == (DomTreeNode *)0x0) ||
             (cVar2 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::dominates
                                ((DomTreeNodeBase *)DT,(DomTreeNodeBase *)Node), cVar2 == '\0')) {
            std::
            _Rb_tree<llvm::BasicBlock*,llvm::BasicBlock*,std::_Identity<llvm::BasicBlock*>,std::less<llvm::BasicBlock*>,std::allocator<llvm::BasicBlock*>>
            ::_M_insert_unique<llvm::BasicBlock*const&>(this_00,&local_50);
          }
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 != local_48);
    }
  }
  return (DomSetType *)this_00;
}

Assistant:

DomSetType &calculate(const llvm::PostDominatorTree &DT,
                          const llvm::DomTreeNode *Node) {
        llvm::BasicBlock *BB = Node->getBlock();
        auto &S = frontiers[BB];

#if LLVM_VERSION_MAJOR >= 11
        bool empty_roots = DT.root_size() == 0;
#else
        bool empty_roots = DT.getRoots().empty();
#endif
        if (empty_roots)
            return S;

        // calculate DFlocal[Node]
        if (BB) {
            for (auto *P : predecessors(BB)) {
                // Does Node immediately dominate this predecessor?
                auto *SINode = DT[P];
                if (SINode && SINode->getIDom() != Node)
                    S.insert(P);
            }
        }

        // At this point, S is DFlocal.  Now we union in DFup's of our children.
        // Loop through and visit the nodes that Node immediately dominates
        // (Node's children in the IDomTree)
        for (auto *IDominee : *Node) {
            const auto &ChildDF = calculate(DT, IDominee);

            for (auto *cdfi : ChildDF) {
                if (!DT.properlyDominates(Node, DT[cdfi]))
                    S.insert(cdfi);
            }
        }

        return S;
    }